

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::GetTileSize
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,Uint32 *TileSizeX,Uint32 *TileSizeY
          )

{
  string msg;
  string local_28;
  
  FormatString<char[96]>
            (&local_28,
             (char (*) [96])
             "Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature."
            );
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"GetTileSize",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
             ,0x131);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

GetTileSize(Uint32& TileSizeX, Uint32& TileSizeY) override
    {
        UNSUPPORTED("Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature.");
    }